

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_data__int3x1
          (ColladaParserAutoGen14Private *this,ParserChar *text,size_t textLength)

{
  bool bVar1;
  
  bVar1 = GeneratedSaxParser::
          ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
          ::characterData2Sint32Data
                    (&this->
                      super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                     ,text,textLength,0x2ec9);
  return bVar1;
}

Assistant:

bool ColladaParserAutoGen14Private::_data__int3x1( const ParserChar* text, size_t textLength )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
        int3x1__ValidationData* validationData = (int3x1__ValidationData*)mValidationDataStack.top();
        DISABLE_WARNING_UNUSED(validationData)
return characterData2Sint32Data(text, textLength, &ColladaParserAutoGen14::data__int3x1, &validate__cg_int3x1__stream, &validationData->validationWholeSize, &validate__cg_int);
    }
    else
    {
return characterData2Sint32Data(text, textLength, &ColladaParserAutoGen14::data__int3x1);
    }
#else
    {
return characterData2Sint32Data(text, textLength, &ColladaParserAutoGen14::data__int3x1);
    } // validation
#endif

}